

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3VdbeMemSetStr(Mem *pMem,char *z,int n,u8 enc,_func_void_void_ptr *xDel)

{
  int iVar1;
  size_t sVar2;
  ushort uVar3;
  bool bVar4;
  uint local_54;
  uint local_40;
  ushort local_3a;
  u32 nAlloc;
  uint uStack_34;
  u16 flags;
  int iLimit;
  int nByte;
  _func_void_void_ptr *xDel_local;
  u8 enc_local;
  int n_local;
  char *z_local;
  Mem *pMem_local;
  
  if (z == (char *)0x0) {
    sqlite3VdbeMemSetNull(pMem);
    return 0;
  }
  if (pMem->db == (sqlite3 *)0x0) {
    nAlloc = 1000000000;
  }
  else {
    nAlloc = pMem->db->aLimit[0];
  }
  local_3a = 2;
  if (enc == '\0') {
    local_3a = 0x10;
  }
  uStack_34 = n;
  if (n < 0) {
    if (enc == '\x01') {
      sVar2 = strlen(z);
      uStack_34 = (uint)sVar2 & 0x7fffffff;
    }
    else {
      uStack_34 = 0;
      while( true ) {
        bVar4 = false;
        if ((int)uStack_34 <= (int)nAlloc) {
          bVar4 = z[(int)uStack_34] != '\0' || z[(int)(uStack_34 + 1)] != '\0';
        }
        if (!bVar4) break;
        uStack_34 = uStack_34 + 2;
      }
    }
    local_3a = local_3a | 0x200;
  }
  if (xDel == (_func_void_void_ptr *)0xffffffffffffffff) {
    local_40 = uStack_34;
    if ((local_3a & 0x200) != 0) {
      iVar1 = 2;
      if (enc == '\x01') {
        iVar1 = 1;
      }
      local_40 = iVar1 + uStack_34;
    }
    if ((int)nAlloc < (int)uStack_34) {
      iVar1 = sqlite3ErrorToParser(pMem->db,0x12);
      return iVar1;
    }
    if (local_40 < 0x21) {
      local_54 = 0x20;
    }
    else {
      local_54 = local_40;
    }
    iVar1 = sqlite3VdbeMemClearAndResize(pMem,local_54);
    if (iVar1 != 0) {
      return 7;
    }
    memcpy(pMem->z,z,(ulong)local_40);
  }
  else {
    sqlite3VdbeMemRelease(pMem);
    pMem->z = z;
    if (xDel == sqlite3MallocSize) {
      pMem->zMalloc = pMem->z;
      iVar1 = sqlite3DbMallocSize(pMem->db,pMem->zMalloc);
      pMem->szMalloc = iVar1;
    }
    else {
      pMem->xDel = xDel;
      uVar3 = 0x400;
      if (xDel == (_func_void_void_ptr *)0x0) {
        uVar3 = 0x800;
      }
      local_3a = local_3a | uVar3;
    }
  }
  pMem->n = uStack_34;
  pMem->flags = local_3a;
  if (enc == '\0') {
    enc = '\x01';
  }
  pMem->enc = enc;
  if ((pMem->enc == '\x01') || (iVar1 = sqlite3VdbeMemHandleBom(pMem), iVar1 == 0)) {
    if ((int)nAlloc < (int)uStack_34) {
      pMem_local._4_4_ = 0x12;
    }
    else {
      pMem_local._4_4_ = 0;
    }
  }
  else {
    pMem_local._4_4_ = 7;
  }
  return pMem_local._4_4_;
}

Assistant:

SQLITE_PRIVATE int sqlite3VdbeMemSetStr(
  Mem *pMem,          /* Memory cell to set to string value */
  const char *z,      /* String pointer */
  int n,              /* Bytes in string, or negative */
  u8 enc,             /* Encoding of z.  0 for BLOBs */
  void (*xDel)(void*) /* Destructor function */
){
  int nByte = n;      /* New value for pMem->n */
  int iLimit;         /* Maximum allowed string or blob size */
  u16 flags = 0;      /* New value for pMem->flags */

  assert( pMem->db==0 || sqlite3_mutex_held(pMem->db->mutex) );
  assert( !sqlite3VdbeMemIsRowSet(pMem) );

  /* If z is a NULL pointer, set pMem to contain an SQL NULL. */
  if( !z ){
    sqlite3VdbeMemSetNull(pMem);
    return SQLITE_OK;
  }

  if( pMem->db ){
    iLimit = pMem->db->aLimit[SQLITE_LIMIT_LENGTH];
  }else{
    iLimit = SQLITE_MAX_LENGTH;
  }
  flags = (enc==0?MEM_Blob:MEM_Str);
  if( nByte<0 ){
    assert( enc!=0 );
    if( enc==SQLITE_UTF8 ){
      nByte = 0x7fffffff & (int)strlen(z);
    }else{
      for(nByte=0; nByte<=iLimit && (z[nByte] | z[nByte+1]); nByte+=2){}
    }
    flags |= MEM_Term;
  }

  /* The following block sets the new values of Mem.z and Mem.xDel. It
  ** also sets a flag in local variable "flags" to indicate the memory
  ** management (one of MEM_Dyn or MEM_Static).
  */
  if( xDel==SQLITE_TRANSIENT ){
    u32 nAlloc = nByte;
    if( flags&MEM_Term ){
      nAlloc += (enc==SQLITE_UTF8?1:2);
    }
    if( nByte>iLimit ){
      return sqlite3ErrorToParser(pMem->db, SQLITE_TOOBIG);
    }
    testcase( nAlloc==0 );
    testcase( nAlloc==31 );
    testcase( nAlloc==32 );
    if( sqlite3VdbeMemClearAndResize(pMem, (int)MAX(nAlloc,32)) ){
      return SQLITE_NOMEM_BKPT;
    }
    memcpy(pMem->z, z, nAlloc);
  }else{
    sqlite3VdbeMemRelease(pMem);
    pMem->z = (char *)z;
    if( xDel==SQLITE_DYNAMIC ){
      pMem->zMalloc = pMem->z;
      pMem->szMalloc = sqlite3DbMallocSize(pMem->db, pMem->zMalloc);
    }else{
      pMem->xDel = xDel;
      flags |= ((xDel==SQLITE_STATIC)?MEM_Static:MEM_Dyn);
    }
  }

  pMem->n = nByte;
  pMem->flags = flags;
  pMem->enc = (enc==0 ? SQLITE_UTF8 : enc);

#ifndef SQLITE_OMIT_UTF16
  if( pMem->enc!=SQLITE_UTF8 && sqlite3VdbeMemHandleBom(pMem) ){
    return SQLITE_NOMEM_BKPT;
  }
#endif

  if( nByte>iLimit ){
    return SQLITE_TOOBIG;
  }

  return SQLITE_OK;
}